

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

string * __thiscall
soul::ASTUtilities::
getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
          (string *__return_storage_ptr__,ASTUtilities *this,
          vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
          *params,ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *args)

{
  bool bVar1;
  value_type *pvVar2;
  const_reference pvVar3;
  UsingDeclaration *pUVar4;
  Structure *this_00;
  Expression *pEVar5;
  Constant *pCVar6;
  VariableDeclaration *pVVar7;
  char *pcVar8;
  size_t sVar9;
  pool_ref<soul::AST::Expression> *ppVar10;
  NamespaceRef *pNVar11;
  NamespaceAliasDeclaration *pNVar12;
  Namespace *this_01;
  ProcessorAliasDeclaration *pPVar13;
  ProcessorBase *this_02;
  void *o;
  void *o_00;
  void *o_01;
  Value *local_388;
  string local_320;
  pool_ref<soul::AST::ASTObject> local_300;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> local_2f8;
  pool_ptr<soul::AST::ProcessorAliasDeclaration> v_2;
  pool_ref<soul::AST::Expression> local_2c8;
  pool_ptr<soul::AST::NamespaceRef> local_2c0;
  pool_ptr<soul::AST::Namespace> local_2b8;
  pool_ptr<soul::AST::Namespace> ns;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> local_2a8;
  pool_ptr<soul::AST::NamespaceAliasDeclaration> v_1;
  string local_298 [39];
  byte local_271;
  pool_ptr<soul::AST::Constant> local_270;
  byte local_261;
  pool_ptr<soul::AST::Constant> local_260;
  Value *local_258;
  Value *value;
  pool_ptr<soul::AST::VariableDeclaration> local_248;
  pool_ptr<soul::AST::VariableDeclaration> v;
  string local_238;
  undefined1 local_218 [8];
  string local_210;
  undefined1 local_1f0 [8];
  Type targetType;
  pool_ptr<soul::AST::UsingDeclaration> local_1d0;
  pool_ptr<soul::AST::UsingDeclaration> u;
  value_type *param;
  size_t i;
  stringstream key;
  ostream local_198 [376];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *local_20;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *args_local;
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  *params_local;
  
  local_20 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)params;
  args_local = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)this;
  params_local = (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                  *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  param = (value_type *)0x0;
  do {
    pvVar2 = (value_type *)
             std::
             vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
             ::size((vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                     *)args_local);
    if (pvVar2 <= param) {
      std::__cxx11::stringstream::str();
      v.object._4_4_ = 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)&i);
      return __return_storage_ptr__;
    }
    pvVar3 = std::
             vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
             ::operator[]((vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                           *)args_local,(size_type)param);
    if (param != (value_type *)0x0) {
      std::operator<<(local_198,',');
    }
    targetType.structure.object = (Structure *)pvVar3->object;
    cast<soul::AST::UsingDeclaration,soul::AST::ASTObject>
              ((soul *)&local_1d0,(pool_ref<soul::AST::ASTObject> *)&targetType.structure);
    pool_ref<soul::AST::ASTObject>::~pool_ref
              ((pool_ref<soul::AST::ASTObject> *)&targetType.structure);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_1d0);
    if (bVar1) {
      pvVar2 = (value_type *)
               ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size(local_20);
      if (param < pvVar2) {
        ppVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                            (local_20,(size_t)param);
        pEVar5 = pool_ref<soul::AST::Expression>::operator->(ppVar10);
        (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[5])(local_1f0);
      }
      else {
        pUVar4 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&local_1d0);
        pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&pUVar4->targetType);
        (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[5])(local_1f0);
      }
      bVar1 = Type::isStruct((Type *)local_1f0);
      if (bVar1) {
        Type::getStruct((Type *)local_218);
        this_00 = RefCountedPtr<soul::Structure>::get((RefCountedPtr<soul::Structure> *)local_218);
        getSignatureString_abi_cxx11_((string *)(local_218 + 8),(ASTUtilities *)this_00,o);
        std::operator<<(local_198,(string *)(local_218 + 8));
        std::__cxx11::string::~string((string *)(local_218 + 8));
        RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_218);
      }
      else {
        Type::getShortIdentifierDescription_abi_cxx11_(&local_238,(Type *)local_1f0);
        std::operator<<(local_198,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
      }
      v.object._4_4_ = 4;
      Type::~Type((Type *)local_1f0);
    }
    else {
      v.object._4_4_ = 0;
    }
    pool_ptr<soul::AST::UsingDeclaration>::~pool_ptr(&local_1d0);
    if (v.object._4_4_ == 0) {
      value = (Value *)pvVar3->object;
      cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>
                ((soul *)&local_248,(pool_ref<soul::AST::ASTObject> *)&value);
      pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&value);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_248);
      if (bVar1) {
        pvVar2 = (value_type *)
                 ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size(local_20);
        local_261 = 0;
        local_271 = 0;
        if (param < pvVar2) {
          ppVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                              (local_20,(size_t)param);
          pEVar5 = pool_ref<soul::AST::Expression>::operator->(ppVar10);
          (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_260);
          local_261 = 1;
          pCVar6 = pool_ptr<soul::AST::Constant>::operator->(&local_260);
        }
        else {
          pVVar7 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_248);
          pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&pVVar7->initialValue);
          (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_270);
          local_271 = 1;
          pCVar6 = pool_ptr<soul::AST::Constant>::operator->(&local_270);
        }
        local_388 = &pCVar6->value;
        if ((local_271 & 1) != 0) {
          pool_ptr<soul::AST::Constant>::~pool_ptr(&local_270);
        }
        if ((local_261 & 1) != 0) {
          pool_ptr<soul::AST::Constant>::~pool_ptr(&local_260);
        }
        local_258 = local_388;
        pcVar8 = (char *)soul::Value::getPackedData(local_388);
        sVar9 = soul::Value::getPackedDataSize(local_258);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_298,pcVar8,sVar9,(allocator *)((long)&v_1.object + 7));
        std::operator<<(local_198,local_298);
        std::__cxx11::string::~string(local_298);
        std::allocator<char>::~allocator((allocator<char> *)((long)&v_1.object + 7));
        v.object._4_4_ = 4;
      }
      else {
        v.object._4_4_ = 0;
      }
      pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_248);
      if (v.object._4_4_ == 0) {
        ns.object = (Namespace *)pvVar3->object;
        cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>
                  ((soul *)&local_2a8,(pool_ref<soul::AST::ASTObject> *)&ns);
        pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&ns);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_2a8);
        if (bVar1) {
          pvVar2 = (value_type *)
                   ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size
                             (local_20);
          if (param < pvVar2) {
            ppVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                                (local_20,(size_t)param);
            local_2c8.object = ppVar10->object;
            cast<soul::AST::NamespaceRef,soul::AST::Expression>((soul *)&local_2c0,&local_2c8);
            pNVar11 = pool_ptr<soul::AST::NamespaceRef>::operator->(&local_2c0);
            pool_ptr<soul::AST::Namespace>::pool_ptr<soul::AST::Namespace,void>
                      (&local_2b8,pNVar11->ns);
            pool_ptr<soul::AST::NamespaceRef>::~pool_ptr(&local_2c0);
            pool_ref<soul::AST::Expression>::~pool_ref(&local_2c8);
          }
          else {
            pNVar12 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->(&local_2a8);
            local_2b8.object = (pNVar12->resolvedNamespace).object;
          }
          this_01 = pool_ptr<soul::AST::Namespace>::get(&local_2b8);
          getSignatureString_abi_cxx11_((string *)&v_2,(ASTUtilities *)this_01,o_00);
          std::operator<<(local_198,(string *)&v_2);
          std::__cxx11::string::~string((string *)&v_2);
          v.object._4_4_ = 4;
          pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_2b8);
        }
        else {
          v.object._4_4_ = 0;
        }
        pool_ptr<soul::AST::NamespaceAliasDeclaration>::~pool_ptr(&local_2a8);
        if (v.object._4_4_ == 0) {
          local_300.object = pvVar3->object;
          cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>
                    ((soul *)&local_2f8,&local_300);
          pool_ref<soul::AST::ASTObject>::~pool_ref(&local_300);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_2f8);
          if (bVar1) {
            pPVar13 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->(&local_2f8);
            this_02 = pool_ptr<soul::AST::ProcessorBase>::get(&pPVar13->resolvedProcessor);
            getSignatureString_abi_cxx11_(&local_320,(ASTUtilities *)this_02,o_01);
            std::operator<<(local_198,(string *)&local_320);
            std::__cxx11::string::~string((string *)&local_320);
            v.object._4_4_ = 4;
          }
          else {
            v.object._4_4_ = 0;
          }
          pool_ptr<soul::AST::ProcessorAliasDeclaration>::~pool_ptr(&local_2f8);
          if (v.object._4_4_ == 0) {
            throwInternalCompilerError("getSpecialisationSignature",0xed);
          }
        }
      }
    }
    param = (value_type *)((long)&param->object + 1);
  } while( true );
}

Assistant:

static std::string getSpecialisationSignature (const ParamList& params, const ArgList& args)
    {
        std::stringstream key;

        for (size_t i = 0; i < params.size(); ++i)
        {
            auto& param = params[i];

            if (i > 0)
                key << ',';

            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                auto targetType = (i < args.size()) ? args[i]->resolveAsType() : u->targetType->resolveAsType();

                if (targetType.isStruct())
                    key << getSignatureString (targetType.getStruct().get());
                else
                    key << targetType.getShortIdentifierDescription();

                continue;
            }

            if (auto v = cast<AST::VariableDeclaration> (param))
            {
                auto& value = (i < args.size()) ?  args[i]->getAsConstant()->value : v->initialValue->getAsConstant()->value;
                key << std::string (static_cast<const char*> (value.getPackedData()), value.getPackedDataSize());
                continue;
            }

            if (auto v = cast<AST::NamespaceAliasDeclaration> (param))
            {
                auto ns = (i < args.size()) ? cast<AST::NamespaceRef> (args[i])->ns : v->resolvedNamespace;
                key << getSignatureString (ns.get());
                continue;
            }

            if (auto v = cast<AST::ProcessorAliasDeclaration> (param))
            {
                key << getSignatureString (v->resolvedProcessor.get());
                continue;
            }

            SOUL_ASSERT_FALSE;
        }

        return key.str();
    }